

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::dealloc
               (value_and_holder *v_h)

{
  bool bVar1;
  
  bVar1 = detail::value_and_holder::holder_constructed(v_h);
  if (bVar1) {
    std::
    unique_ptr<anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
    ::~unique_ptr((unique_ptr<anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>,_std::default_delete<anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>
                   *)(v_h->vh + 1));
    detail::value_and_holder::set_holder_constructed(v_h,false);
  }
  else {
    detail::call_operator_delete(*v_h->vh,v_h->type->type_size,v_h->type->type_align);
  }
  *v_h->vh = (void *)0x0;
  return;
}

Assistant:

static void dealloc(detail::value_and_holder &v_h) {
        if (v_h.holder_constructed()) {
            v_h.holder<holder_type>().~holder_type();
            v_h.set_holder_constructed(false);
        }
        else {
            detail::call_operator_delete(v_h.value_ptr<type>(),
                v_h.type->type_size,
                v_h.type->type_align
            );
        }
        v_h.value_ptr() = nullptr;
    }